

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

string * __thiscall
duckdb::Bit::ToString_abi_cxx11_(string *__return_storage_ptr__,Bit *this,bitstring_t str)

{
  idx_t iVar1;
  tuple<char_*,_std::default_delete<char[]>_> tVar2;
  char *output;
  bitstring_t bits;
  bitstring_t bits_00;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_30;
  
  output = str.value._8_8_;
  bits.value._8_8_ = str.value._0_8_;
  bits.value._0_8_ = bits.value._8_8_;
  iVar1 = BitLength(this,bits);
  tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(iVar1);
  bits_00.value.pointer.ptr =
       (char *)tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
  bits_00.value._0_8_ = bits.value._8_8_;
  local_30._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ToString(this,bits_00,output);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             iVar1 + (long)tVar2.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Bit::ToString(bitstring_t str) {
	auto len = BitLength(str);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(len);
	ToString(str, buffer.get());
	return string(buffer.get(), len);
}